

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::FtraceConfig::ParseFromArray(FtraceConfig *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint *extraout_RDX;
  uint *puVar8;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  bool bVar18;
  uint *local_80;
  Field local_78;
  uint *local_68;
  uint *local_60;
  FtraceConfig *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->ftrace_events_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->ftrace_events_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_40 = &this->atrace_categories_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_40,(this->atrace_categories_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_48 = &this->atrace_apps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_48,(this->atrace_apps_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_50 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar17 = (uint *)(size + (long)raw);
  puVar8 = extraout_RDX;
  do {
    lVar7 = 7;
    if (puVar17 <= raw) goto LAB_00239a58;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar9 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar5 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar13 = puVar9;
      for (lVar6 = lVar7;
          (puVar15 = puVar13, uVar12 = uVar5, (char)bVar1 < '\0' &&
          (bVar18 = 0x38 < lVar6 - 7U, bVar10 = bVar18 || puVar17 <= puVar13, puVar8 = puVar13,
          puVar15 = puVar9, uVar12 = 0, !bVar18 && puVar17 > puVar13)); lVar6 = lVar6 + 7) {
        bVar1 = (byte)*puVar13;
        puVar13 = (uint *)((long)puVar13 + 1);
        uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f);
        puVar8 = puVar13;
      }
      puVar9 = puVar15;
      if (bVar10) {
        puVar9 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar9 == (uint *)raw) goto LAB_00239a58;
    }
    uVar4 = (uint)(uVar12 >> 3);
    if ((uVar4 == 0) || (puVar17 <= puVar9)) {
switchD_002398d2_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_78.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar9 >= puVar17;
        if (puVar9 < puVar17) {
          puVar8 = (uint *)((long)puVar9 + 1);
          puVar13 = (uint *)(ulong)((byte)*puVar9 & 0x7f);
          puVar15 = puVar13;
          uVar14 = 0;
          if ((char)(byte)*puVar9 < '\0') {
            puVar15 = (uint *)0x0;
            uVar14 = 0;
            lVar7 = 7;
            puVar16 = puVar8;
            do {
              bVar18 = 0x38 < lVar7 - 7U;
              bVar10 = bVar18 || puVar17 <= puVar16;
              if (bVar18 || puVar17 <= puVar16) goto LAB_00239a5e;
              uVar2 = *puVar16;
              puVar16 = (uint *)((long)puVar16 + 1);
              puVar13 = (uint *)((ulong)puVar13 |
                                (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar7 & 0x3f));
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar2 < '\0');
            puVar15 = (uint *)((ulong)puVar13 & 0xffffffff);
            puVar8 = puVar16;
            uVar14 = (uint)((ulong)puVar13 >> 0x20);
          }
        }
        else {
          puVar15 = (uint *)0x0;
          uVar14 = 0;
        }
LAB_00239a5e:
        puVar13 = (uint *)(ulong)uVar14;
        if (bVar10) {
          puVar8 = puVar9;
          puVar13 = puVar11;
          puVar15 = puVar11;
        }
        local_80 = puVar9;
        local_60 = (uint *)raw;
        if (puVar8 != puVar9) goto LAB_00239a85;
        uVar12 = 0;
        bVar10 = false;
        local_78.int_value_ = (uint64_t)puVar11;
        goto LAB_00239ac7;
      case 1:
        puVar8 = puVar9 + 2;
        if (puVar17 < puVar8) {
LAB_00239a58:
          uVar12 = 0;
          bVar10 = false;
          local_78.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_00239ac7;
        }
        puVar15 = *(uint **)puVar9;
        puVar13 = (uint *)((ulong)puVar15 >> 0x20);
        break;
      case 2:
        bVar10 = puVar9 >= puVar17;
        puVar13 = local_68;
        if (puVar9 < puVar17) {
          bVar1 = (byte)*puVar9;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar15 = (uint *)((long)puVar9 + 1U);
          for (; (puVar8 = puVar15, puVar13 = puVar11, (char)bVar1 < '\0' &&
                 (bVar18 = 0x38 < lVar7 - 7U, bVar10 = bVar18 || puVar17 <= puVar15,
                 puVar8 = (uint *)((long)puVar9 + 1U), puVar13 = local_68,
                 !bVar18 && puVar17 > puVar15)); lVar7 = lVar7 + 7) {
            bVar1 = (byte)*puVar15;
            puVar15 = (uint *)((long)puVar15 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
          }
        }
        local_68 = puVar13;
        if (bVar10) {
          puVar8 = puVar9;
          local_68 = (uint *)0x0;
        }
        if ((puVar8 == puVar9) || ((uint *)((long)puVar17 - (long)puVar8) < local_68)) {
          puVar13 = (uint *)0x0;
          puVar15 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar13 = (uint *)((ulong)puVar8 >> 0x20);
          puVar15 = (uint *)((ulong)puVar8 & 0xffffffff);
          puVar8 = (uint *)((long)puVar8 + (long)local_68);
          bVar10 = true;
          puVar11 = local_68;
        }
        local_80 = puVar9;
        if (!bVar10) goto LAB_00239a58;
        goto LAB_00239a85;
      default:
        goto switchD_002398d2_caseD_3;
      case 5:
        puVar8 = puVar9 + 1;
        puVar13 = (uint *)0x0;
        if (puVar17 < puVar8) goto LAB_00239a58;
        puVar15 = (uint *)(ulong)*puVar9;
      }
      puVar11 = (uint *)0x0;
LAB_00239a85:
      bVar10 = true;
      raw = puVar8;
      if ((uVar4 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_78.int_value_ = (ulong)puVar15 & 0xffffffff | (long)puVar13 << 0x20;
        uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_78.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_00239ac7:
    puVar9 = (uint *)0x7;
    if (!bVar10) {
      local_78.size_ = (uint32_t)uVar12;
      local_78.type_ = (uint8_t)(uVar12 >> 0x30);
      local_78.id_ = (uint16_t)(uVar12 >> 0x20);
      local_58 = this;
      do {
        if (local_78.id_ == 0) {
          return puVar17 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 0x11) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar4 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar4 < 0x10) {
          uVar3 = (*(code *)(&DAT_0034d7f8 + *(int *)(&DAT_0034d7f8 + (ulong)uVar4 * 4)))();
          return (bool)uVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_78,local_50);
        do {
          if (puVar17 <= raw) goto LAB_00239d15;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar8 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar5;
            puVar13 = puVar8;
            if ((char)(byte)*raw < '\0') {
              lVar7 = 7;
              puVar15 = puVar8;
              do {
                bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar15;
                uVar12 = 0;
                puVar13 = puVar8;
                if (bVar10) break;
                uVar4 = *puVar15;
                puVar13 = (uint *)((long)puVar15 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f);
                lVar7 = lVar7 + 7;
                uVar12 = uVar5;
                puVar15 = puVar13;
              } while ((char)(byte)uVar4 < '\0');
            }
            puVar8 = puVar13;
            if (bVar10) {
              puVar8 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar8 == (uint *)raw) goto LAB_00239d15;
          }
          uVar4 = (uint)(uVar12 >> 3);
          if ((uVar4 == 0) || (puVar17 <= puVar8)) {
switchD_00239db4_caseD_3:
            local_78.int_value_ = 0;
            bVar10 = false;
            uVar12 = 0;
            goto LAB_00239fee;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            local_78.int_value_ = 0;
            bVar10 = puVar8 >= puVar17;
            if (puVar8 < puVar17) {
              puVar13 = (uint *)((long)puVar8 + 1);
              uVar14 = (byte)*puVar8 & 0x7f;
              uVar5 = (ulong)uVar14;
              puVar15 = (uint *)(ulong)uVar14;
              puVar9 = puVar13;
              uVar14 = 0;
              if ((char)(byte)*puVar8 < '\0') {
                puVar15 = (uint *)0x0;
                lVar7 = 7;
                puVar11 = puVar13;
                do {
                  bVar18 = 0x38 < lVar7 - 7U;
                  bVar10 = bVar18 || puVar17 <= puVar11;
                  puVar9 = puVar13;
                  uVar14 = 0;
                  if (bVar18 || puVar17 <= puVar11) break;
                  bVar1 = (byte)*puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                  lVar7 = lVar7 + 7;
                  if (-1 < (char)bVar1) {
                    puVar15 = (uint *)(uVar5 & 0xffffffff);
                  }
                  puVar9 = puVar11;
                  uVar14 = (uint)(uVar5 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              puVar15 = (uint *)0x0;
              uVar14 = 0;
            }
            if (bVar10) {
              puVar15 = (uint *)local_78.int_value_;
            }
            puVar13 = (uint *)(ulong)uVar14;
            if (bVar10) {
              puVar9 = puVar8;
              puVar13 = (uint *)local_78.int_value_;
            }
            this = local_58;
            puVar11 = (uint *)local_78.int_value_;
            local_68 = puVar8;
            local_60 = (uint *)raw;
            if (puVar9 == puVar8) {
              uVar12 = 0;
              bVar10 = false;
            }
            else {
LAB_00239fad:
              bVar10 = true;
              raw = puVar9;
              if ((uVar4 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
                local_78.int_value_ = (ulong)puVar15 & 0xffffffff | (long)puVar13 << 0x20;
                uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_78.int_value_ = 0;
                uVar12 = 0;
              }
            }
            break;
          case 1:
            puVar9 = puVar8 + 2;
            if (puVar9 <= puVar17) {
              puVar15 = *(uint **)puVar8;
              puVar13 = (uint *)((ulong)puVar15 >> 0x20);
LAB_00239e1c:
              puVar11 = (uint *)0x0;
              goto LAB_00239fad;
            }
            goto LAB_00239d15;
          case 2:
            bVar10 = puVar8 >= puVar17;
            puVar13 = local_80;
            if (puVar8 < puVar17) {
              puVar15 = (uint *)((long)puVar8 + 1);
              puVar11 = (uint *)(ulong)((byte)*puVar8 & 0x7f);
              puVar9 = puVar15;
              puVar13 = puVar11;
              if ((char)(byte)*puVar8 < '\0') {
                lVar7 = 7;
                puVar16 = puVar15;
                do {
                  bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar16;
                  puVar9 = puVar15;
                  puVar13 = local_80;
                  if (bVar10) break;
                  uVar14 = *puVar16;
                  puVar9 = (uint *)((long)puVar16 + 1);
                  puVar11 = (uint *)((ulong)puVar11 |
                                    (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f));
                  lVar7 = lVar7 + 7;
                  puVar16 = puVar9;
                  puVar13 = puVar11;
                } while ((char)(byte)uVar14 < '\0');
              }
            }
            local_80 = puVar13;
            puVar15 = (uint *)0x0;
            if (bVar10) {
              puVar9 = puVar8;
              local_80 = puVar15;
            }
            if (puVar9 == puVar8) {
              puVar13 = (uint *)0x0;
              bVar10 = false;
              puVar11 = (uint *)0x0;
            }
            else if ((uint *)((long)puVar17 - (long)puVar9) < local_80) {
              puVar15 = (uint *)0x0;
              puVar13 = (uint *)0x0;
              bVar10 = false;
              puVar11 = (uint *)0x0;
            }
            else {
              puVar13 = (uint *)((ulong)puVar9 >> 0x20);
              puVar15 = (uint *)((ulong)puVar9 & 0xffffffff);
              puVar9 = (uint *)((long)puVar9 + (long)local_80);
              bVar10 = true;
              puVar11 = local_80;
            }
            if (bVar10) goto LAB_00239fad;
            local_78.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
            break;
          default:
            goto switchD_00239db4_caseD_3;
          case 5:
            puVar9 = puVar8 + 1;
            puVar13 = (uint *)0x0;
            if (puVar9 <= puVar17) {
              puVar15 = (uint *)(ulong)*puVar8;
              goto LAB_00239e1c;
            }
LAB_00239d15:
            local_78.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
          }
LAB_00239fee:
        } while (bVar10);
        local_78.size_ = (uint32_t)uVar12;
        local_78.type_ = (uint8_t)(uVar12 >> 0x30);
        local_78.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool FtraceConfig::ParseFromArray(const void* raw, size_t size) {
  ftrace_events_.clear();
  atrace_categories_.clear();
  atrace_apps_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* ftrace_events */:
        ftrace_events_.emplace_back();
        field.get(&ftrace_events_.back());
        break;
      case 2 /* atrace_categories */:
        atrace_categories_.emplace_back();
        field.get(&atrace_categories_.back());
        break;
      case 3 /* atrace_apps */:
        atrace_apps_.emplace_back();
        field.get(&atrace_apps_.back());
        break;
      case 10 /* buffer_size_kb */:
        field.get(&buffer_size_kb_);
        break;
      case 11 /* drain_period_ms */:
        field.get(&drain_period_ms_);
        break;
      case 12 /* compact_sched */:
        (*compact_sched_).ParseFromArray(field.data(), field.size());
        break;
      case 13 /* symbolize_ksyms */:
        field.get(&symbolize_ksyms_);
        break;
      case 14 /* initialize_ksyms_synchronously_for_testing */:
        field.get(&initialize_ksyms_synchronously_for_testing_);
        break;
      case 15 /* throttle_rss_stat */:
        field.get(&throttle_rss_stat_);
        break;
      case 16 /* disable_generic_events */:
        field.get(&disable_generic_events_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}